

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O0

sc_object * __thiscall sc_core::sc_simcontext::find_object(sc_simcontext *this,char *name)

{
  sc_object *psVar1;
  undefined4 in_stack_00000060;
  int in_stack_00000064;
  sc_object_manager *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  
  if (find_object::warn_find_object) {
    find_object::warn_find_object = false;
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,(char *)in_stack_00000068,
               in_stack_00000064);
  }
  psVar1 = sc_object_manager::find_object
                     (in_stack_00000068,(char *)CONCAT44(in_stack_00000064,in_stack_00000060));
  return psVar1;
}

Assistant:

sc_object*
sc_simcontext::find_object( const char* name )
{
    static bool warn_find_object=true;
    if ( warn_find_object )
    {
	warn_find_object = false;
	SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "sc_simcontext::find_object() is deprecated,\n" \
            " use sc_find_object()" );
    }
    return m_object_manager->find_object( name );
}